

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O0

unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
* __thiscall HuffTree::get_alphabet(HuffTree *this)

{
  bool bVar1;
  reference this_00;
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  *in_RDI;
  TreeNode *node;
  stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
  s;
  vector<bool,_std::allocator<bool>_> code;
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  *alphabet;
  value_type *in_stack_fffffffffffffe58;
  pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_> *in_stack_fffffffffffffe60;
  pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_> *__in;
  undefined1 in_stack_fffffffffffffebf;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffec0;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffef0;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffef8;
  pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_> local_f8 [3];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined1 local_11;
  
  local_11 = 0;
  std::
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                   *)0x1231ce);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                     0x1231dc);
  if (bVar1) {
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_28 = 0;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x123211);
    std::
    stack<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::deque<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>>>
    ::
    stack<std::deque<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>,std::allocator<std::pair<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>>>,void>
              ((stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
                *)in_stack_fffffffffffffe60);
    local_f8[0].second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                   ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                    in_stack_fffffffffffffe60);
    std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>::
    pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_&,_true>
              (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->first,
               (vector<bool,_std::allocator<bool>_> *)0x123253);
    std::
    stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
    ::push((stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
            *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>::~pair
              ((pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_> *)0x123279);
    while (bVar1 = std::
                   stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
                   ::empty((stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
                            *)0x123286), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = std::
                stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
                ::top((stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
                       *)0x1232a8);
      __in = local_f8;
      std::tie<HuffTree::TreeNode*,std::vector<bool,std::allocator<bool>>>
                (&__in->first,(vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffe60);
      std::tuple<HuffTree::TreeNode*&,std::vector<bool,std::allocator<bool>>&>::operator=
                ((tuple<HuffTree::TreeNode_*&,_std::vector<bool,_std::allocator<bool>_>_&> *)this_00
                 ,__in);
      std::
      stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
      ::pop((stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
             *)0x1232ef);
      if ((*(byte *)(local_f8[0].second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ + 0x18) & 1)
          != 0) {
        in_stack_fffffffffffffe60 =
             (pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_> *)
             std::
             unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
             ::operator[]((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                           *)in_stack_fffffffffffffe60,(key_type *)in_stack_fffffffffffffe58);
        std::vector<bool,_std::allocator<bool>_>::operator=
                  (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *
                         )0x12339b);
      if (bVar1) {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   in_stack_fffffffffffffe60);
        std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>::
        pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_&,_true>
                  (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->first,
                   (vector<bool,_std::allocator<bool>_> *)0x1233e5);
        std::
        stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
        ::push((stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
                *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>::~pair
                  ((pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_> *)0x12340b
                  );
        std::vector<bool,_std::allocator<bool>_>::pop_back
                  ((vector<bool,_std::allocator<bool>_> *)0x123418);
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *
                         )0x123453);
      if (bVar1) {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   in_stack_fffffffffffffe60);
        std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>::
        pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_&,_true>
                  (in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->first,
                   (vector<bool,_std::allocator<bool>_> *)0x12349d);
        std::
        stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
        ::push((stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
                *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>::~pair
                  ((pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_> *)0x1234bd
                  );
        std::vector<bool,_std::allocator<bool>_>::pop_back
                  ((vector<bool,_std::allocator<bool>_> *)0x1234ca);
      }
    }
    std::
    stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
    ::~stack((stack<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::deque<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<HuffTree::TreeNode_*,_std::vector<bool,_std::allocator<bool>_>_>_>_>_>
              *)0x123500);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x12350d);
  }
  return in_RDI;
}

Assistant:

std::unordered_map<char, std::vector<bool>> HuffTree::get_alphabet() {
    std::unordered_map<char, std::vector<bool>> alphabet;

    if (root) {
        std::vector<bool> code = {};
        std::stack<std::pair<TreeNode *, std::vector<bool>>> s;
        s.push({root.get(), code});
        while (!s.empty()) {
            TreeNode *node;
            std::tie(node, code) = s.top();
            s.pop();
            if (node->_is_leaf) {
                alphabet[node->_data] = code;
            }
            if (node->_left) {
                code.push_back(false);
                s.push({node->_left.get(), code});
                code.pop_back();
            }
            if (node->_right) {
                code.push_back(true);
                s.push({node->_right.get(), code});
                code.pop_back();
            }
        }
    }
    return alphabet;
}